

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O2

void __thiscall
chrono::ChAparticle::ComputeJacobianForContactPart
          (ChAparticle *this,ChVector<double> *abs_point,ChMatrix33<double> *contact_plane,
          type_constraint_tuple *jacobian_tuple_N,type_constraint_tuple *jacobian_tuple_U,
          type_constraint_tuple *jacobian_tuple_V,bool second)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChRowVectorRef local_1a8;
  ChVector<double> m_p1_loc;
  undefined1 local_170 [16];
  variable_if_dynamic<long,__1> local_160;
  ChMatrix33<double> *local_138;
  undefined8 local_130;
  double local_128;
  double local_120;
  undefined8 local_118;
  undefined1 local_110 [16];
  undefined8 local_100;
  undefined8 local_f8;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true> local_f0;
  ChMatrix33<double> Jr1;
  ChMatrix33<double> Jx1;
  
  ChFrame<double>::TransformPointParentToLocal(&m_p1_loc,(ChFrame<double> *)this,abs_point);
  local_138 = contact_plane;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jx1,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_138);
  if (!second) {
    local_138 = (ChMatrix33<double> *)&DAT_bff0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&Jx1,(Scalar *)&local_138);
  }
  auVar1._8_8_ = m_p1_loc.m_data[1];
  auVar1._0_8_ = m_p1_loc.m_data[0];
  local_138 = (ChMatrix33<double> *)0x0;
  local_170._8_8_ =
       &(this->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix;
  auVar2._0_8_ = -m_p1_loc.m_data[2];
  auVar2._8_4_ = 0;
  auVar2._12_4_ = 0x80000000;
  local_110._0_8_ = -m_p1_loc.m_data[0];
  local_110._8_4_ = SUB84(m_p1_loc.m_data[1],0);
  local_110._12_4_ = (uint)((ulong)m_p1_loc.m_data[1] >> 0x20) ^ 0x80000000;
  local_130 = vmovlps_avx(auVar2);
  local_120 = m_p1_loc.m_data[2];
  local_118 = 0;
  local_128 = m_p1_loc.m_data[1];
  local_100 = vmovlps_avx(auVar1);
  local_f8 = 0;
  local_170._0_8_ = contact_plane;
  local_160.m_value = (long)&local_138;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jr1,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)local_170);
  if (second) {
    local_170._0_8_ = &DAT_bff0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&Jr1,(Scalar *)local_170);
  }
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_f0,&Jx1.super_Matrix<double,_3,_3,_1,_3,_3>,0);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Get_Cq
            (&local_1a8,jacobian_tuple_N);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_170,&local_1a8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
              *)local_170,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_f0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_f0,&Jx1.super_Matrix<double,_3,_3,_1,_3,_3>,1);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Get_Cq
            (&local_1a8,jacobian_tuple_U);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_170,&local_1a8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
              *)local_170,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_f0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_f0,&Jx1.super_Matrix<double,_3,_3,_1,_3,_3>,2);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Get_Cq
            (&local_1a8,jacobian_tuple_V);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_170,&local_1a8,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
              *)local_170,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_f0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_f0,&Jr1.super_Matrix<double,_3,_3,_1,_3,_3>,0);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Get_Cq
            (&local_1a8,jacobian_tuple_N);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_170,&local_1a8,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
              *)local_170,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_f0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_f0,&Jr1.super_Matrix<double,_3,_3,_1,_3,_3>,1);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Get_Cq
            (&local_1a8,jacobian_tuple_U);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_170,&local_1a8,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
              *)local_170,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_f0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_f0,&Jr1.super_Matrix<double,_3,_3,_1,_3,_3>,2);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Get_Cq
            (&local_1a8,jacobian_tuple_V);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_170,&local_1a8,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
              *)local_170,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_f0);
  return;
}

Assistant:

void ChAparticle::ComputeJacobianForContactPart(
    const ChVector<>& abs_point,
    ChMatrix33<>& contact_plane,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_N,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_U,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_V,
    bool second) {
    ChVector<> m_p1_loc = this->TransformPointParentToLocal(abs_point);

    ChMatrix33<> Jx1 = contact_plane.transpose();
    if (!second)
        Jx1 *= -1;
    
    ChStarMatrix33<> Ps1(m_p1_loc);
    ChMatrix33<> Jr1 = contact_plane.transpose() * GetA() * Ps1;
    if (second)
        Jr1 *= -1;

    jacobian_tuple_N.Get_Cq().segment(0, 3) = Jx1.row(0);
    jacobian_tuple_U.Get_Cq().segment(0, 3) = Jx1.row(1);
    jacobian_tuple_V.Get_Cq().segment(0, 3) = Jx1.row(2);

    jacobian_tuple_N.Get_Cq().segment(3, 3) = Jr1.row(0);
    jacobian_tuple_U.Get_Cq().segment(3, 3) = Jr1.row(1);
    jacobian_tuple_V.Get_Cq().segment(3, 3) = Jr1.row(2);
}